

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeNF
          (ChElementHexaANCF_3813_9 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  char *__function;
  long lVar6;
  double *pdVar7;
  Index index;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ShapeVector N;
  ChMatrixNM<double,_1,_11> Nz;
  ChMatrixNM<double,_1,_11> Ny;
  ChMatrixNM<double,_1,_11> Nx;
  ChMatrixNM<double,_1,_3> local_1c8;
  ChMatrixNM<double,_1,_3> local_1b0;
  ChMatrixNM<double,_1,_3> local_198;
  ShapeVector local_180;
  ShapeVector local_128;
  ShapeVector local_d0;
  ShapeVector local_78;
  
  ShapeFunctions(this,&local_180,U,V,W);
  dVar10 = Calc_detJ0(this,U,V,W,&local_78,&local_d0,&local_128,&local_198,&local_1b0,&local_1c8);
  *detJ = dVar10;
  *detJ = dVar10 * (this->m_dimensions).m_data[0] * (this->m_dimensions).m_data[1] *
                   (this->m_dimensions).m_data[2] * 0.125;
  pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar6 = 0;
  pdVar7 = pdVar4;
  do {
    if (lVar3 < 3) {
      __function = 
      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
LAB_006f7d2e:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
    }
    if (lVar5 + -3 < lVar6 * 3) {
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_006f7d2e;
    }
    pdVar1 = pdVar4 + lVar6 * 3;
    uVar8 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar8 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar8)) {
      uVar8 = 3;
    }
    dVar10 = local_180.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
             m_data.array[lVar6];
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        pdVar7[uVar9] = dVar10 * pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (uVar8 < 3) {
      do {
        pdVar7[uVar8] = dVar10 * pdVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != 3);
    }
    lVar6 = lVar6 + 1;
    pdVar7 = pdVar7 + 3;
    if (lVar6 == 0xb) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det(J) here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    detJ = Calc_detJ0(U, V, W);
    detJ *= m_dimensions.x() * m_dimensions.y() * m_dimensions.z() / 8;

    for (int i = 0; i < 11; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}